

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O3

RTPAddress * __thiscall
jrtplib::RTPIPv4Address::CreateCopy(RTPIPv4Address *this,RTPMemoryManager *mgr)

{
  undefined2 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  RTPAddress *pRVar4;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    pRVar4 = (RTPAddress *)operator_new(0x18);
  }
  else {
    iVar3 = (*mgr->_vptr_RTPMemoryManager[2])(mgr,0x18,0x17);
    pRVar4 = (RTPAddress *)CONCAT44(extraout_var,iVar3);
  }
  uVar2 = *(undefined4 *)&(this->super_RTPAddress).field_0xc;
  uVar1 = this->port;
  pRVar4->addresstype = IPv4Address;
  pRVar4->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013bce0;
  *(undefined4 *)&pRVar4->field_0xc = uVar2;
  *(undefined2 *)&pRVar4[1]._vptr_RTPAddress = uVar1;
  *(short *)((long)&pRVar4[1]._vptr_RTPAddress + 2) = uVar1 + 1;
  return pRVar4;
}

Assistant:

RTPAddress *RTPIPv4Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv4Address *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ip,port);
	return a;
}